

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffrhdu(fitsfile *fptr,int *hdutype,int *status)

{
  char *pcVar1;
  FITSfile *pFVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  bool bVar6;
  int tstatus;
  char urltype [20];
  char name [75];
  char card [81];
  char value [71];
  char xname [71];
  char comm [73];
  int local_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined3 uStack_1e0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  char local_1c0;
  char local_178 [96];
  char local_118 [79];
  char local_c9;
  char local_c8 [80];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  iVar3 = ffgrec(fptr,1,local_178,status);
  if (iVar3 < 1) {
    strncpy((char *)&local_1c8,local_178,8);
    local_1c0 = '\0';
    uVar4 = 7;
    do {
      if (*(char *)((long)&local_1c8 + (ulong)uVar4) != ' ') break;
      *(undefined1 *)((long)&local_1c8 + (ulong)uVar4) = 0;
      bVar6 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar6);
    iVar3 = ffpsvc(local_178,local_118,local_78,status);
    if (iVar3 < 1) {
      if (CONCAT31((undefined3)uStack_1c4,local_1c8._3_1_) == 0x454c50 && local_1c8 == 0x504d4953) {
        ffpinit(fptr,status);
LAB_0013c1e5:
        if (hdutype != (int *)0x0) {
          *hdutype = 0;
        }
      }
      else if (local_1c0 == '\0' && CONCAT44(uStack_1c4,local_1c8) == 0x4e4f49534e455458) {
        iVar3 = ffc2s(local_118,local_c8,status);
        if (0 < iVar3) {
          ffxmsg(5,"Bad value string for XTENSION keyword:");
          pcVar5 = local_118;
          goto LAB_0013c174;
        }
        pcVar5 = &local_c9;
        do {
          pcVar1 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
        } while (*pcVar1 == ' ');
        iVar3 = strcmp(pcVar5,"TABLE");
        if (iVar3 == 0) {
          ffainit(fptr,status);
          if (hdutype != (int *)0x0) {
            *hdutype = 1;
          }
        }
        else {
          iVar3 = strcmp(pcVar5,"BINTABLE");
          if (iVar3 != 0) {
            iVar3 = strcmp(pcVar5,"A3DTABLE");
            if (iVar3 != 0) {
              iVar3 = strcmp(pcVar5,"3DTABLE");
              if (iVar3 != 0) {
                local_1ec = 0;
                ffpinit(fptr,&local_1ec);
                if (hdutype == (int *)0x0 || local_1ec != 0xfb) {
                  *status = local_1ec;
                  goto LAB_0013c1e5;
                }
                *hdutype = -1;
                goto LAB_0013c25a;
              }
            }
          }
          ffbinit(fptr,status);
          if (hdutype != (int *)0x0) {
            *hdutype = 2;
          }
        }
      }
      else if ((local_178[0] == '\n') || (local_178[0] == '\0')) {
        *status = 0x6b;
      }
      else {
        *status = 0xfc;
        ffxmsg(5,"Extension doesn\'t start with SIMPLE or XTENSION keyword. (ffrhdu)");
        ffxmsg(5,local_178);
      }
LAB_0013c25a:
      pFVar2 = fptr->Fptr;
      if (pFVar2->headstart[(long)pFVar2->curhdu + 1] < pFVar2->logfilesize) {
        pFVar2->lasthdu = 0;
      }
      else {
        pFVar2->lasthdu = 1;
        ffurlt(fptr,(char *)&local_1e8,status);
        if ((CONCAT31((undefined3)uStack_1e4,local_1e8._3_1_) == 0x2f2f3a && local_1e8 == 0x3a6d656d
            ) || (CONCAT35(uStack_1e0,CONCAT41(uStack_1e4,local_1e8._3_1_)) == 0x2f2f3a7065656b &&
                  CONCAT44(uStack_1e4,local_1e8) == 0x3a7065656b6d656d)) {
          fftrun(fptr,fptr->Fptr->headstart[(long)fptr->Fptr->curhdu + 1],status);
        }
      }
      goto LAB_0013c17e;
    }
    ffxmsg(5,"Cannot read value of first  keyword in header (ffrhdu):");
    pcVar5 = local_178;
  }
  else {
    pcVar5 = "Cannot read first keyword in header (ffrhdu).";
  }
LAB_0013c174:
  ffxmsg(5,pcVar5);
LAB_0013c17e:
  return *status;
}

Assistant:

int ffrhdu(fitsfile *fptr,    /* I - FITS file pointer */
           int *hdutype,      /* O - type of HDU       */
           int *status)       /* IO - error status     */
/*
  read the required keywords of the CHDU and initialize the corresponding
  structure elements that describe the format of the HDU
*/
{
    int ii, tstatus;
    char card[FLEN_CARD];
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xname[FLEN_VALUE], *xtension, urltype[20];

    if (*status > 0)
        return(*status);

    if (ffgrec(fptr, 1, card, status) > 0 )  /* get the 80-byte card */
    {
        ffpmsg("Cannot read first keyword in header (ffrhdu).");
        return(*status);
    }
    strncpy(name,card,8);  /* first 8 characters = the keyword name */
    name[8] = '\0';

    for (ii=7; ii >= 0; ii--)  /* replace trailing blanks with nulls */
    {
        if (name[ii] == ' ')
            name[ii] = '\0';
        else
            break;
    }

    if (ffpsvc(card, value, comm, status) > 0)   /* parse value and comment */
    {
        ffpmsg("Cannot read value of first  keyword in header (ffrhdu):");
        ffpmsg(card);
        return(*status);
    }

    if (!strcmp(name, "SIMPLE"))        /* this is the primary array */
    {

       ffpinit(fptr, status);           /* initialize the primary array */

       if (hdutype != NULL)
           *hdutype = 0;
    }

    else if (!strcmp(name, "XTENSION"))   /* this is an XTENSION keyword */
    {
        if (ffc2s(value, xname, status) > 0)  /* get the value string */
        {
            ffpmsg("Bad value string for XTENSION keyword:");
            ffpmsg(value);
            return(*status);
        }

        xtension = xname;
        while (*xtension == ' ')  /* ignore any leading spaces in name */
           xtension++;

        if (!strcmp(xtension, "TABLE"))
        {
            ffainit(fptr, status);       /* initialize the ASCII table */
            if (hdutype != NULL)
                *hdutype = 1;
        }

        else if (!strcmp(xtension, "BINTABLE") ||
                 !strcmp(xtension, "A3DTABLE") ||
                 !strcmp(xtension, "3DTABLE") )
        {
            ffbinit(fptr, status);       /* initialize the binary table */
            if (hdutype != NULL)
                *hdutype = 2;
        }

        else
        {
            tstatus = 0;
            ffpinit(fptr, &tstatus);       /* probably an IMAGE extension */

            if (tstatus == UNKNOWN_EXT && hdutype != NULL)
                *hdutype = -1;       /* don't recognize this extension type */
            else
            {
                *status = tstatus;
                if (hdutype != NULL)
                    *hdutype = 0;
            }
        }
    }

    else     /*  not the start of a new extension */
    {
        if (card[0] == 0  ||
            card[0] == 10)     /* some editors append this character to EOF */
        {           
            *status = END_OF_FILE;
        }
        else
        {
          *status = UNKNOWN_REC;  /* found unknown type of record */
          ffpmsg
        ("Extension doesn't start with SIMPLE or XTENSION keyword. (ffrhdu)");
        ffpmsg(card);
        }
    }

    /*  compare the starting position of the next HDU (if any) with the size */
    /*  of the whole file to see if this is the last HDU in the file */

    if ((fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] < 
        (fptr->Fptr)->logfilesize )
    {
        (fptr->Fptr)->lasthdu = 0;  /* no, not the last HDU */
    }
    else
    {
        (fptr->Fptr)->lasthdu = 1;  /* yes, this is the last HDU */

        /* special code for mem:// type files (FITS file in memory) */
        /* Allocate enough memory to hold the entire HDU. */
        /* Without this code, CFITSIO would repeatedly realloc  memory */
        /* to incrementally increase the size of the file by 2880 bytes */
        /* at a time, until it reached the final size */
 
        ffurlt(fptr, urltype, status);
        if (!strcmp(urltype,"mem://") || !strcmp(urltype,"memkeep://"))
        {
            fftrun(fptr, (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1],
               status);
        }
    }
    return(*status);
}